

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::ScopeObjectChain::TryGetDebuggerScopePropertyInfo
          (ScopeObjectChain *this,PropertyId propertyId,RegSlot location,int offset,
          bool *isPropertyInDebuggerScope,bool *isConst,bool *isInDeadZone)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar5;
  undefined4 *puVar6;
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar7;
  WriteBarrierPtr *this_00;
  DebuggerScope **ppDVar8;
  byte local_6d;
  undefined1 local_58 [7];
  bool isOffsetInScope;
  DebuggerScopeProperty debuggerScopeProperty;
  DebuggerScope *debuggerScope;
  int i;
  bool *isConst_local;
  bool *isPropertyInDebuggerScope_local;
  int offset_local;
  RegSlot location_local;
  PropertyId propertyId_local;
  ScopeObjectChain *this_local;
  
  ppLVar5 = Memory::WriteBarrierPtr::operator_cast_to_List__((WriteBarrierPtr *)this);
  if (*ppLVar5 ==
      (List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1831,"(pScopeChain)","pScopeChain");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (isPropertyInDebuggerScope == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1832,"(isPropertyInDebuggerScope)","isPropertyInDebuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (isConst == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1833,"(isConst)","isConst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  *isPropertyInDebuggerScope = false;
  *isConst = false;
  debuggerScope._4_4_ = 0;
  do {
    pLVar7 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->pScopeChain);
    iVar4 = JsUtil::ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>::Count
                      (&pLVar7->
                        super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>);
    if (iVar4 <= debuggerScope._4_4_) {
      return false;
    }
    pLVar7 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->pScopeChain);
    this_00 = (WriteBarrierPtr *)
              JsUtil::
              List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(pLVar7,debuggerScope._4_4_);
    ppDVar8 = Memory::WriteBarrierPtr::operator_cast_to_DebuggerScope__(this_00);
    debuggerScopeProperty._8_8_ = *ppDVar8;
    bVar2 = DebuggerScope::IsParamScope((DebuggerScope *)debuggerScopeProperty._8_8_);
    if ((!bVar2) &&
       (bVar2 = DebuggerScope::TryGetProperty
                          ((DebuggerScope *)debuggerScopeProperty._8_8_,propertyId,location,
                           (DebuggerScopeProperty *)local_58), bVar2)) {
      bVar2 = DebuggerScope::IsOffsetInScope((DebuggerScope *)debuggerScopeProperty._8_8_,offset);
      local_6d = 1;
      if (!bVar2) {
        bVar3 = DebuggerScope::IsBlockObjectScope((DebuggerScope *)debuggerScopeProperty._8_8_);
        local_6d = bVar3 ^ 0xff;
      }
      *isPropertyInDebuggerScope = (bool)(local_6d & 1);
      if (bVar2) {
        if (isInDeadZone != (bool *)0x0) {
          bVar2 = DebuggerScopeProperty::IsInDeadZone((DebuggerScopeProperty *)local_58,offset);
          *isInDeadZone = bVar2;
        }
        bVar2 = DebuggerScopeProperty::IsConst((DebuggerScopeProperty *)local_58);
        *isConst = bVar2;
        return true;
      }
    }
    debuggerScope._4_4_ = debuggerScope._4_4_ + 1;
  } while( true );
}

Assistant:

bool ScopeObjectChain::TryGetDebuggerScopePropertyInfo(PropertyId propertyId, RegSlot location, int offset, bool* isPropertyInDebuggerScope, bool *isConst, bool* isInDeadZone)
    {
        Assert(pScopeChain);
        Assert(isPropertyInDebuggerScope);
        Assert(isConst);

        *isPropertyInDebuggerScope = false;
        *isConst = false;

        // Search through each block scope until we find the current scope.  If the register was found
        // in any of the scopes going down until we reach the scope of the debug break, then it's in scope.
        // if found but not in the scope, the out param will be updated (since it is actually a let or const), so that caller can make a call accordingly.
        for (int i = 0; i < pScopeChain->Count(); i++)
        {
            Js::DebuggerScope *debuggerScope = pScopeChain->Item(i);
            DebuggerScopeProperty debuggerScopeProperty;
            if (!debuggerScope->IsParamScope() && debuggerScope->TryGetProperty(propertyId, location, &debuggerScopeProperty))
            {
                bool isOffsetInScope = debuggerScope->IsOffsetInScope(offset);

                // For the Object scope, all the properties will have the same location (-1) so they can match. Use further check below to determine the propertyInDebuggerScope
                *isPropertyInDebuggerScope = isOffsetInScope || !debuggerScope->IsBlockObjectScope();

                if (isOffsetInScope)
                {
                    if (isInDeadZone != nullptr)
                    {
                        *isInDeadZone = debuggerScopeProperty.IsInDeadZone(offset);
                    }

                    *isConst = debuggerScopeProperty.IsConst();
                    return true;
                }
            }
        }

        return false;
    }